

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QFileInfo>::emplace<QFileInfo_const&>
          (QMovableArrayOps<QFileInfo> *this,qsizetype i,QFileInfo *args)

{
  QFileInfo **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QFileInfo tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size == i) {
      qVar5 = QArrayDataPointer<QFileInfo>::freeSpaceAtEnd((QArrayDataPointer<QFileInfo> *)this);
      if (qVar5 == 0) goto LAB_00217786;
      QFileInfo::QFileInfo
                ((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr +
                 (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size,
                 args);
LAB_0021786b:
      pqVar2 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0021782a;
    }
LAB_00217786:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QFileInfo>::freeSpaceAtBegin((QArrayDataPointer<QFileInfo> *)this);
      if (qVar5 != 0) {
        QFileInfo::QFileInfo
                  ((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr
                   + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0021786b;
      }
    }
  }
  tmp.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size != 0;
  QArrayDataPointer<QFileInfo>::detachAndGrow
            ((QArrayDataPointer<QFileInfo> *)this,(uint)(i == 0 && bVar6),1,(QFileInfo **)0x0,
             (QArrayDataPointer<QFileInfo> *)0x0);
  if (i == 0 && bVar6) {
    QFileInfo::QFileInfo
              ((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr + -1
               ,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QFileInfo> *)this,i,1);
    QFileInfo::QFileInfo(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QFileInfo::~QFileInfo(&tmp);
LAB_0021782a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }